

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.h
# Opt level: O2

LinkedModelFile * __thiscall
CoreML::Specification::LinkedModel::mutable_linkedmodelfile(LinkedModel *this)

{
  LinkedModelFile *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->LinkType_).linkedmodelfile_;
  }
  else {
    clear_LinkType(this);
    this->_oneof_case_[0] = 1;
    this_00 = (LinkedModelFile *)operator_new(0x28);
    LinkedModelFile::LinkedModelFile(this_00);
    (this->LinkType_).linkedmodelfile_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::LinkedModelFile* LinkedModel::mutable_linkedmodelfile() {
  if (!has_linkedmodelfile()) {
    clear_LinkType();
    set_has_linkedmodelfile();
    LinkType_.linkedmodelfile_ = new ::CoreML::Specification::LinkedModelFile;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LinkedModel.linkedModelFile)
  return LinkType_.linkedmodelfile_;
}